

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

void __thiscall Printer::Printer(Printer *this,DataAttrInfo *attributes_,int attrCount_)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  DataAttrInfo *pDVar4;
  char **ppcVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  char *__s2;
  long lVar10;
  ulong uVar11;
  int i;
  long lVar12;
  ulong uVar13;
  
  this->attrCount = attrCount_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)attrCount_;
  uVar13 = SUB168(auVar1 * ZEXT816(0x44),0);
  if (SUB168(auVar1 * ZEXT816(0x44),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  pDVar4 = (DataAttrInfo *)operator_new__(uVar13);
  if (attrCount_ != 0) {
    lVar9 = 0;
    do {
      pcVar7 = pDVar4->attrName + lVar9 + 7;
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7[4] = '\0';
      pcVar7[5] = '\0';
      pcVar7[6] = '\0';
      pcVar7[7] = '\0';
      pcVar7[8] = '\0';
      pcVar7[9] = '\0';
      pcVar7[10] = '\0';
      pcVar7[0xb] = '\0';
      pcVar7[0xc] = '\0';
      pcVar7[0xd] = '\0';
      pcVar7[0xe] = '\0';
      pcVar7[0xf] = '\0';
      (pDVar4->attrName + lVar9 + 0x17)[0] = '\0';
      (pDVar4->attrName + lVar9 + 0x17)[1] = '\0';
      pcVar7 = pDVar4->relName + lVar9 + 0x10;
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7[4] = '\0';
      pcVar7[5] = '\0';
      pcVar7[6] = '\0';
      pcVar7[7] = '\0';
      pcVar7[8] = '\0';
      pcVar7[9] = '\0';
      pcVar7[10] = '\0';
      pcVar7[0xb] = '\0';
      pcVar7[0xc] = '\0';
      pcVar7[0xd] = '\0';
      pcVar7[0xe] = '\0';
      pcVar7[0xf] = '\0';
      pcVar7 = pDVar4->relName + lVar9;
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7[4] = '\0';
      pcVar7[5] = '\0';
      pcVar7[6] = '\0';
      pcVar7[7] = '\0';
      pcVar7[8] = '\0';
      pcVar7[9] = '\0';
      pcVar7[10] = '\0';
      pcVar7[0xb] = '\0';
      pcVar7[0xc] = '\0';
      pcVar7[0xd] = '\0';
      pcVar7[0xe] = '\0';
      pcVar7[0xf] = '\0';
      lVar9 = lVar9 + 0x44;
    } while ((long)attrCount_ * 0x44 - lVar9 != 0);
  }
  this->attributes = pDVar4;
  lVar9 = 0;
  for (lVar12 = 0; lVar10 = (long)attrCount_, lVar12 < lVar10; lVar12 = lVar12 + 1) {
    DataAttrInfo::operator=
              ((DataAttrInfo *)(this->attributes->relName + lVar9),
               (DataAttrInfo *)(attributes_->relName + lVar9));
    attrCount_ = this->attrCount;
    lVar9 = lVar9 + 0x44;
  }
  this->iCount = 0;
  ppcVar5 = (char **)malloc(lVar10 * 8);
  this->psHeader = ppcVar5;
  uVar13 = lVar10 * 4;
  if (attrCount_ < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar13);
  this->spaces = piVar6;
  uVar13 = 0;
  do {
    if ((long)attrCount_ <= (long)uVar13) {
      return;
    }
    pcVar7 = (char *)operator_new__(0x35);
    this->psHeader[uVar13] = pcVar7;
    pcVar7 = this->psHeader[uVar13];
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    pcVar7[8] = '\0';
    pcVar7[9] = '\0';
    pcVar7[10] = '\0';
    pcVar7[0xb] = '\0';
    pcVar7[0xc] = '\0';
    pcVar7[0xd] = '\0';
    pcVar7[0xe] = '\0';
    pcVar7[0xf] = '\0';
    pcVar7[0x20] = '\0';
    pcVar7[0x21] = '\0';
    pcVar7[0x22] = '\0';
    pcVar7[0x23] = '\0';
    pcVar7[0x24] = '\0';
    pcVar7[0x25] = '\0';
    pcVar7[0x26] = '\0';
    pcVar7[0x27] = '\0';
    pcVar7[0x28] = '\0';
    pcVar7[0x29] = '\0';
    pcVar7[0x2a] = '\0';
    pcVar7[0x2b] = '\0';
    pcVar7[0x2c] = '\0';
    pcVar7[0x2d] = '\0';
    pcVar7[0x2e] = '\0';
    pcVar7[0x2f] = '\0';
    pcVar7[0x10] = '\0';
    pcVar7[0x11] = '\0';
    pcVar7[0x12] = '\0';
    pcVar7[0x13] = '\0';
    pcVar7[0x14] = '\0';
    pcVar7[0x15] = '\0';
    pcVar7[0x16] = '\0';
    pcVar7[0x17] = '\0';
    pcVar7[0x18] = '\0';
    pcVar7[0x19] = '\0';
    pcVar7[0x1a] = '\0';
    pcVar7[0x1b] = '\0';
    pcVar7[0x1c] = '\0';
    pcVar7[0x1d] = '\0';
    pcVar7[0x1e] = '\0';
    pcVar7[0x1f] = '\0';
    pcVar7[0x2d] = '\0';
    pcVar7[0x2e] = '\0';
    pcVar7[0x2f] = '\0';
    pcVar7[0x30] = '\0';
    pcVar7[0x31] = '\0';
    pcVar7[0x32] = '\0';
    pcVar7[0x33] = '\0';
    pcVar7[0x34] = '\0';
    pDVar4 = this->attributes;
    pcVar7 = pDVar4[uVar13].attrName;
    uVar2 = this->attrCount;
    if (this->attrCount < 1) {
      uVar2 = 0;
    }
    __s2 = pDVar4->attrName;
    for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
      if (uVar13 != uVar11) {
        iVar3 = strcmp(pcVar7,__s2);
        if (iVar3 == 0) {
          sprintf(this->psHeader[uVar13],"%s.%s",pDVar4 + uVar13,pcVar7);
          goto LAB_0010b15a;
        }
      }
      __s2 = __s2 + 0x44;
    }
    strcpy(this->psHeader[uVar13],pcVar7);
LAB_0010b15a:
    if (this->attributes[uVar13].attrType == STRING) {
      iVar3 = this->attributes[uVar13].attrLength;
      if (0x34 < iVar3) {
        iVar3 = 0x35;
      }
      piVar6 = this->spaces;
      piVar6[uVar13] = iVar3;
      pcVar7 = this->psHeader[uVar13];
    }
    else {
      pcVar7 = this->psHeader[uVar13];
      sVar8 = strlen(pcVar7);
      if (sVar8 < 0xd) {
        sVar8 = 0xc;
      }
      piVar6 = this->spaces;
      iVar3 = (int)sVar8;
      piVar6[uVar13] = iVar3;
    }
    sVar8 = strlen(pcVar7);
    iVar3 = iVar3 - (int)sVar8;
    piVar6[uVar13] = iVar3;
    if (iVar3 < 1) {
      piVar6[uVar13] = 0;
      sVar8 = strlen(pcVar7);
      (pcVar7 + sVar8)[0] = ' ';
      (pcVar7 + sVar8)[1] = '\0';
    }
    uVar13 = uVar13 + 1;
    attrCount_ = this->attrCount;
  } while( true );
}

Assistant:

Printer::Printer(const DataAttrInfo *attributes_, const int attrCount_)
{
    attrCount = attrCount_;
    attributes = new DataAttrInfo[attrCount];

    for (int i=0; i < attrCount; i++)
        attributes[i] = attributes_[i];

    // Number of tuples printed
    iCount = 0;

    // Figure out what the header information will look like.  Normally,
    // we can just use the attribute name, but if that appears more than
    // once, then we should use "relation.attribute".

    // this line broke when using CC
    // changing to use malloc and free instead of new and delete
    // psHeader = (char **) new (char *)[attrCount];
    psHeader = (char**)malloc(attrCount * sizeof(char*));

    // Also figure out the number of spaces between each attribute
    spaces = new int[attrCount];

    for (int i=0; i < attrCount; i++ ) {
        // Try to find the attribute in another column
        int bFound = 0;
        psHeader[i] = new char[MAXPRINTSTRING];
        memset(psHeader[i],0,MAXPRINTSTRING);

        for (int j=0; j < attrCount; j++)
            if (j != i &&
                strcmp(attributes[i].attrName,
                       attributes[j].attrName) == 0) {
                bFound = 1;
                break;
            }

        if (bFound)
            sprintf(psHeader[i], "%s.%s",
                    attributes[i].relName, attributes[i].attrName);
        else
            strcpy(psHeader[i], attributes[i].attrName);

        if (attributes[i].attrType==STRING)
            spaces[i] = min(attributes[i].attrLength, MAXPRINTSTRING);
        else
            spaces[i] = max(12, strlen(psHeader[i]));

        // We must subtract out those characters that will be for the
        // header.
        spaces[i] -= strlen(psHeader[i]);

        // If there are negative (or zero) spaces, then insert a single
        // space.
        if (spaces[i] < 1) {
            // The psHeader will give us the space we need
            spaces[i] = 0;
            strcat(psHeader[i]," ");
        }
    }
}